

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.h
# Opt level: O0

hash_t __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::GetHashCode(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
              *this)

{
  code *pcVar1;
  bool bVar2;
  hash_t hVar3;
  LPCUTF8 s;
  size_t sVar4;
  undefined4 *puVar5;
  size_t byteLength;
  LPCUTF8 source;
  JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
  *this_local;
  
  s = GetSource(this,L"Hash Code Calculation");
  sVar4 = GetByteLength(this,L"Hash Code Calculation");
  if (0xfffffffe < sVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.h"
                                ,0x79,"(byteLength < ((uint32_t)~((uint32_t)0)))",
                                "byteLength < MAXUINT32");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  hVar3 = JsUtil::CharacterBuffer<unsigned_char>::StaticGetHashCode(s,(charcount_t)sVar4);
  return hVar3;
}

Assistant:

virtual hash_t GetHashCode() override
        {
            LPCUTF8 source = GetSource(_u("Hash Code Calculation"));
            size_t byteLength = GetByteLength(_u("Hash Code Calculation"));
            Assert(byteLength < MAXUINT32);
            return JsUtil::CharacterBuffer<utf8char_t>::StaticGetHashCode(source, (charcount_t)byteLength);
        }